

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O3

QString * QUtf8::convertToUnicode(QString *__return_storage_ptr__,QByteArrayView in)

{
  char16_t *pcVar1;
  storage_type *in_RCX;
  char16_t *this;
  QByteArrayView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,in.m_size,Uninitialized);
  this = (__return_storage_ptr__->d).ptr;
  if ((QUtf8 *)this == (QUtf8 *)0x0) {
    this = &QString::_empty;
  }
  in_00.m_data = in_RCX;
  pcVar1 = convertToUnicode((QUtf8 *)this,(char16_t *)in.m_size,in_00);
  QString::truncate(__return_storage_ptr__,(char *)((long)pcVar1 - (long)this >> 1),__length);
  return __return_storage_ptr__;
}

Assistant:

QString QUtf8::convertToUnicode(QByteArrayView in)
{
    // UTF-8 to UTF-16 always needs the exact same number of words or less:
    //    UTF-8     UTF-16
    //   1 byte     1 word
    //   2 bytes    1 word
    //   3 bytes    1 word
    //   4 bytes    2 words (one surrogate pair)
    // That is, we'll use the full buffer if the input is US-ASCII (1-byte UTF-8),
    // half the buffer for U+0080-U+07FF text (e.g., Greek, Cyrillic, Arabic) or
    // non-BMP text, and one third of the buffer for U+0800-U+FFFF text (e.g, CJK).
    //
    // The table holds for invalid sequences too: we'll insert one replacement char
    // per invalid byte.
    QString result(in.size(), Qt::Uninitialized);
    QChar *data = const_cast<QChar*>(result.constData()); // we know we're not shared
    const QChar *end = convertToUnicode(data, in);
    result.truncate(end - data);
    return result;
}